

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_floor_variance(gauden_t *g)

{
  vector_t *ppfVar1;
  vector_t pfVar2;
  float32 fVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float64 fVar12;
  
  if (g->fullvar != (vector_t ****)0x0) {
    uVar5 = g->n_mgau;
    if (uVar5 != 0) {
      uVar6 = g->n_feat;
      uVar9 = (ulong)uVar6;
      uVar10 = 0;
      do {
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar4 = (ulong)g->n_density;
          uVar11 = 0;
          do {
            if ((int)uVar4 == 0) {
              uVar4 = 0;
            }
            else {
              uVar9 = 0;
              do {
                fVar12 = determinant((float32 **)g->fullvar[uVar10][uVar11][uVar9],g->veclen[uVar11]
                                    );
                fVar3 = min_var;
                if (((double)fVar12 <= 0.0) && (uVar4 = (ulong)g->veclen[uVar11], uVar4 != 0)) {
                  ppfVar1 = g->fullvar[uVar10][uVar11][uVar9];
                  uVar7 = 0;
                  do {
                    pfVar2 = ppfVar1[uVar7];
                    uVar8 = 0;
                    do {
                      if (uVar7 == uVar8) {
                        if (pfVar2[uVar7] <= (float)fVar3 && (float)fVar3 != pfVar2[uVar7]) {
                          pfVar2[uVar7] = (float)fVar3;
                        }
                      }
                      else {
                        pfVar2[uVar8] = 0.0;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar4 != uVar8);
                    uVar7 = uVar7 + 1;
                  } while (uVar7 != uVar4);
                }
                uVar9 = uVar9 + 1;
                uVar4 = (ulong)g->n_density;
              } while (uVar9 < uVar4);
              uVar9 = (ulong)g->n_feat;
            }
            uVar11 = uVar11 + 1;
            uVar6 = (uint)uVar9;
          } while (uVar11 < uVar9);
          uVar5 = g->n_mgau;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar5);
    }
  }
  if (g->var != (vector_t ***)0x0) {
    uVar5 = g->n_mgau;
    if (uVar5 != 0) {
      uVar6 = g->n_feat;
      uVar9 = (ulong)uVar6;
      uVar10 = 0;
      do {
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar4 = (ulong)g->n_density;
          uVar11 = 0;
          do {
            if ((int)uVar4 == 0) {
              uVar4 = 0;
            }
            else {
              uVar9 = 0;
              do {
                vector_floor(g->var[uVar10][uVar11][uVar9],g->veclen[uVar11],min_var);
                uVar9 = uVar9 + 1;
                uVar4 = (ulong)g->n_density;
              } while (uVar9 < uVar4);
              uVar9 = (ulong)g->n_feat;
            }
            uVar11 = uVar11 + 1;
            uVar6 = (uint)uVar9;
          } while (uVar11 < uVar9);
          uVar5 = g->n_mgau;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar5);
    }
  }
  return 0;
}

Assistant:

int
gauden_floor_variance(gauden_t *g)
{
    uint32 i, j, k;

    if (g->fullvar != NULL) {
	/* Don't try to "floor" full covariances since there's no easy
	   way to do this.  If they are singular, discard the
	   off-diagonals and floor the diagonals. */
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    if (determinant(g->fullvar[i][j][k], g->veclen[j]) <= 0.0) {
			diag_and_floor(g->fullvar[i][j][k], g->veclen[j], min_var);
		    }
		}
	    }
	}
    }
    if (g->var != NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    vector_floor(g->var[i][j][k], g->veclen[j], min_var);
		}
	    }
	}
    }

    return S3_SUCCESS;
}